

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

void LinearSmoothing(double *input,double width,int fs,int fft_size,double *output)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  uint x_length;
  double *pdVar4;
  double *y;
  double *xi;
  ulong uVar5;
  double *pdVar6;
  double *yi;
  int iVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  uint xi_length;
  double dVar15;
  
  dVar15 = (double)fft_size;
  dVar2 = (double)fs;
  iVar9 = (int)((dVar15 * width) / dVar2);
  uVar3 = iVar9 + 1;
  uVar5 = (ulong)uVar3;
  iVar14 = fft_size / 2;
  iVar7 = iVar14 + iVar9 * 2 + 2;
  x_length = iVar14 + iVar9 * 2 + 3;
  uVar13 = (long)(int)x_length << 3;
  if (iVar7 < -1) {
    uVar13 = 0xffffffffffffffff;
  }
  pdVar4 = (double *)operator_new__(uVar13);
  y = (double *)operator_new__(uVar13);
  uVar13 = (long)iVar14 * 8 + 8;
  if (fft_size < -3) {
    uVar13 = 0xffffffffffffffff;
  }
  xi = (double *)operator_new__(uVar13);
  pdVar6 = pdVar4;
  if (-1 < iVar9) {
    do {
      *pdVar6 = input[uVar5];
      uVar5 = uVar5 - 1;
      pdVar6 = pdVar6 + 1;
    } while (uVar5 != 0);
  }
  iVar11 = uVar3 + iVar14;
  if (1 < fft_size) {
    uVar5 = (ulong)iVar9;
    lVar8 = (long)iVar11;
    if ((long)iVar11 < (long)(uVar5 + 2)) {
      lVar8 = uVar5 + 2;
    }
    memcpy(pdVar4 + uVar5 + 1,input,(~uVar5 + lVar8) * 8);
  }
  if (iVar9 < iVar9 * 2 + 2) {
    iVar12 = iVar11;
    if (iVar11 <= iVar7) {
      iVar12 = iVar7;
    }
    lVar8 = 0;
    iVar10 = iVar14;
    do {
      pdVar4[iVar11 + lVar8] = input[iVar10];
      lVar8 = lVar8 + 1;
      iVar10 = iVar10 + -1;
    } while ((iVar12 - iVar9) - iVar14 != (int)lVar8);
  }
  *y = (*pdVar4 * dVar2) / dVar15;
  if (0 < iVar7) {
    dVar1 = *y;
    uVar5 = 1;
    do {
      dVar1 = dVar1 + (pdVar4[uVar5] * dVar2) / dVar15;
      y[uVar5] = dVar1;
      uVar5 = uVar5 + 1;
    } while (x_length != uVar5);
  }
  xi_length = iVar14 + 1;
  if (-2 < fft_size) {
    uVar5 = 0;
    do {
      xi[uVar5] = ((double)(int)uVar5 / dVar15) * dVar2 + width * -0.5;
      uVar5 = uVar5 + 1;
    } while (xi_length != uVar5);
  }
  pdVar6 = (double *)operator_new__(uVar13);
  yi = (double *)operator_new__(uVar13);
  dVar1 = ((double)((ulong)((double)(int)uVar3 + -0.5) ^ (ulong)DAT_0010e370) * dVar2) / dVar15;
  interp1Q(dVar1,dVar2 / dVar15,y,x_length,xi,xi_length,pdVar6);
  if (-2 < fft_size) {
    uVar5 = 0;
    do {
      xi[uVar5] = xi[uVar5] + width;
      uVar5 = uVar5 + 1;
    } while (xi_length != uVar5);
  }
  interp1Q(dVar1,dVar2 / dVar15,y,x_length,xi,xi_length,yi);
  if (-2 < fft_size) {
    uVar5 = 0;
    do {
      output[uVar5] = (yi[uVar5] - pdVar6[uVar5]) / width;
      uVar5 = uVar5 + 1;
    } while (xi_length != uVar5);
  }
  operator_delete__(pdVar4);
  operator_delete__(y);
  operator_delete__(xi);
  operator_delete__(pdVar6);
  operator_delete__(yi);
  return;
}

Assistant:

void LinearSmoothing(const double *input, double width, int fs, int fft_size,
    double *output) {
  int boundary = static_cast<int>(width * fft_size / fs) + 1;

  // These parameters are set by the other function.
  double *mirroring_spectrum = new double[fft_size / 2 + boundary * 2 + 1];
  double *mirroring_segment = new double[fft_size / 2 + boundary * 2 + 1];
  double *frequency_axis = new double[fft_size / 2 + 1];
  SetParametersForLinearSmoothing(boundary, fft_size, fs, width,
      input, mirroring_spectrum, mirroring_segment, frequency_axis);

  double *low_levels = new double[fft_size / 2 + 1];
  double *high_levels = new double[fft_size / 2 + 1];
  double origin_of_mirroring_axis = -(boundary - 0.5) * fs / fft_size;
  double discrete_frequency_interval = static_cast<double>(fs) / fft_size;

  interp1Q(origin_of_mirroring_axis, discrete_frequency_interval,
      mirroring_segment, fft_size / 2 + boundary * 2 + 1, frequency_axis,
      fft_size / 2 + 1, low_levels);

  for (int i = 0; i <= fft_size / 2; ++i) frequency_axis[i] += width;

  interp1Q(origin_of_mirroring_axis, discrete_frequency_interval,
      mirroring_segment, fft_size / 2 + boundary * 2 + 1, frequency_axis,
      fft_size / 2 + 1, high_levels);

  for (int i = 0; i <= fft_size / 2; ++i)
    output[i] = (high_levels[i] - low_levels[i]) / width;

  delete[] mirroring_spectrum;
  delete[] mirroring_segment;
  delete[] frequency_axis;
  delete[] low_levels;
  delete[] high_levels;
}